

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int decode_session_identifier
              (uint64_t *issued_at,ptls_iovec_t *psk,uint32_t *ticket_age_add,
              ptls_iovec_t *server_name,uint16_t *key_exchange_id,uint16_t *csid,
              ptls_iovec_t *negotiated_protocol,uint8_t *src,uint8_t *end)

{
  long *plVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint *puVar5;
  uint8_t *puVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint8_t *end_00;
  
  iVar10 = 6;
  plVar1 = (long *)src;
  if (1 < (ulong)((long)end - (long)src)) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ulong)src[lVar9] | uVar8 << 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 2);
    plVar1 = (long *)(src + 2);
    if (((uVar8 <= (ulong)((long)end - (long)plVar1)) && (7 < uVar8)) &&
       (*plVar1 == 0x31303030736c7470)) {
      end_00 = (uint8_t *)((long)plVar1 + uVar8);
      src = src + 10;
      iVar4 = ptls_decode64(issued_at,&src,end_00);
      puVar5 = (uint *)src;
      if (iVar4 == 0) {
        iVar4 = 0x32;
        iVar10 = 6;
        if ((ulong)((long)end_00 - (long)src) < 2) {
          bVar3 = false;
        }
        else {
          lVar9 = 0;
          uVar8 = 0;
          do {
            uVar8 = (ulong)src[lVar9] | uVar8 << 8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 2);
          src = src + 2;
          bVar3 = false;
          if (uVar8 <= (ulong)((long)end_00 - (long)src)) {
            psk->base = src;
            src = src + uVar8;
            psk->len = uVar8;
            bVar3 = true;
            iVar10 = 0;
            iVar4 = 0;
          }
        }
        puVar5 = (uint *)src;
        if (bVar3) {
          lVar9 = (long)end_00 - (long)src;
          iVar4 = 0x32;
          if (1 < lVar9) {
            *key_exchange_id = *(ushort *)src << 8 | *(ushort *)src >> 8;
            src = src + 2;
            iVar4 = 0;
          }
          iVar10 = 6;
          puVar5 = (uint *)src;
          if ((1 < lVar9) && (iVar4 = 0x32, 1 < (long)end_00 - (long)src)) {
            *csid = *(ushort *)src << 8 | *(ushort *)src >> 8;
            puVar5 = (uint *)(src + 2);
            iVar4 = 0x32;
            if (3 < (long)end_00 - (long)puVar5) {
              uVar2 = *puVar5;
              *ticket_age_add =
                   uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
              puVar6 = src + 6;
              iVar4 = 0x32;
              iVar10 = 6;
              if ((ulong)((long)end_00 - (long)puVar6) < 2) {
                bVar3 = false;
                src = puVar6;
              }
              else {
                lVar9 = 0;
                uVar8 = 0;
                do {
                  uVar8 = (ulong)puVar6[lVar9] | uVar8 << 8;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 2);
                src = src + 8;
                bVar3 = false;
                if (uVar8 <= (ulong)((long)end_00 - (long)src)) {
                  server_name->base = src;
                  src = src + uVar8;
                  server_name->len = uVar8;
                  bVar3 = true;
                  iVar10 = 0;
                  iVar4 = 0;
                }
              }
              puVar5 = (uint *)src;
              if (bVar3) {
                iVar7 = 0x32;
                iVar10 = 6;
                if (end_00 == src) {
                  bVar3 = false;
                }
                else {
                  puVar6 = src + 1;
                  uVar8 = (ulong)*src;
                  bVar3 = false;
                  src = puVar6;
                  if (uVar8 <= (ulong)((long)end_00 - (long)puVar6)) {
                    negotiated_protocol->base = puVar6;
                    src = puVar6 + uVar8;
                    negotiated_protocol->len = uVar8;
                    bVar3 = true;
                    iVar10 = 0;
                    iVar7 = iVar4;
                  }
                }
                iVar4 = iVar7;
                puVar5 = (uint *)src;
                if (bVar3) {
                  iVar10 = 6;
                  if (src == end_00) {
                    iVar10 = 0;
                  }
                  iVar4 = 0x32;
                  if (src == end_00) {
                    iVar4 = iVar7;
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_0010e095;
    }
  }
  src = (uint8_t *)plVar1;
  iVar4 = 0x32;
  puVar5 = (uint *)src;
LAB_0010e095:
  src = (uint8_t *)puVar5;
  iVar7 = 0x32;
  if (src == end) {
    iVar7 = iVar4;
  }
  if (iVar10 != 0) {
    iVar7 = iVar4;
  }
  return iVar7;
}

Assistant:

int decode_session_identifier(uint64_t *issued_at, ptls_iovec_t *psk, uint32_t *ticket_age_add, ptls_iovec_t *server_name,
                              uint16_t *key_exchange_id, uint16_t *csid, ptls_iovec_t *negotiated_protocol, const uint8_t *src,
                              const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_block(src, end, 2, {
        if (end - src < SESSION_IDENTIFIER_MAGIC_SIZE ||
            memcmp(src, SESSION_IDENTIFIER_MAGIC, SESSION_IDENTIFIER_MAGIC_SIZE) != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        src += SESSION_IDENTIFIER_MAGIC_SIZE;
        if ((ret = ptls_decode64(issued_at, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *psk = ptls_iovec_init(src, end - src);
            src = end;
        });
        if ((ret = ptls_decode16(key_exchange_id, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(csid, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode32(ticket_age_add, &src, end)) != 0)
            goto Exit;
        ptls_decode_open_block(src, end, 2, {
            *server_name = ptls_iovec_init(src, end - src);
            src = end;
        });
        ptls_decode_open_block(src, end, 1, {
            *negotiated_protocol = ptls_iovec_init(src, end - src);
            src = end;
        });
    });

Exit:
    return ret;
}